

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

map_index_t __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
BucketNumber(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,ViewType k)

{
  string_view value;
  map_index_t mVar1;
  LogMessage *pLVar2;
  RealKeyToVariantKeyAlternative<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_b9;
  string_view local_b8;
  undefined1 local_98 [16];
  LogMessageFatal local_88 [22];
  Voidify local_72;
  RealKeyToVariantKey<std::__cxx11::string> local_71;
  VariantKey local_70;
  uint local_5c;
  KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  char *local_50;
  RealKeyToVariantKeyAlternative<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_41;
  string_view local_40;
  uint local_2c;
  string *local_28;
  string *absl_log_internal_check_op_result;
  KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  ViewType k_local;
  
  local_50 = k._M_str;
  local_58 = (KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)k._M_len;
  absl_log_internal_check_op_result = (string *)this;
  this_local = local_58;
  k_local._M_len = (size_t)local_50;
  local_40 = RealKeyToVariantKeyAlternative<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator()(&local_41,k);
  mVar1 = internal::UntypedMapBase::VariantBucketNumber(&this->super_UntypedMapBase,local_40);
  local_2c = absl::lts_20240722::log_internal::GetReferenceableValue(mVar1);
  local_70 = RealKeyToVariantKey<std::__cxx11::string>::operator()
                       (&local_71,(basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  mVar1 = internal::UntypedMapBase::VariantBucketNumber(&this->super_UntypedMapBase,local_70);
  local_5c = absl::lts_20240722::log_internal::GetReferenceableValue(mVar1);
  local_28 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_int,unsigned_int>
                       (&local_2c,&local_5c,
                        "VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k)) == VariantBucketNumber(RealKeyToVariantKey<Key>{}(k))"
                       );
  if (local_28 != (string *)0x0) {
    local_98 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_28);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/map.h"
               ,0x467,local_98._0_8_,local_98._8_8_);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_88);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_72,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_88);
  }
  value._M_str = (char *)k_local._M_len;
  value._M_len = (size_t)this_local;
  local_b8 = RealKeyToVariantKeyAlternative<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator()(&local_b9,value);
  mVar1 = internal::UntypedMapBase::VariantBucketNumber(&this->super_UntypedMapBase,local_b8);
  return mVar1;
}

Assistant:

map_index_t BucketNumber(typename TS::ViewType k) const {
    ABSL_DCHECK_EQ(
        VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k)),
        VariantBucketNumber(RealKeyToVariantKey<Key>{}(k)));
    return VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k));
  }